

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReshapeStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapestatic(NeuralNetworkLayer *this)

{
  ReshapeStaticLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x474) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x474;
    this_00 = (ReshapeStaticLayerParams *)operator_new(0x28);
    ReshapeStaticLayerParams::ReshapeStaticLayerParams(this_00);
    (this->layer_).reshapestatic_ = this_00;
  }
  return (ReshapeStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeStaticLayerParams* NeuralNetworkLayer::mutable_reshapestatic() {
  if (!has_reshapestatic()) {
    clear_layer();
    set_has_reshapestatic();
    layer_.reshapestatic_ = new ::CoreML::Specification::ReshapeStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeStatic)
  return layer_.reshapestatic_;
}